

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O0

void __thiscall
WordSplitSVTest_three_words_Test<wchar_t>::WordSplitSVTest_three_words_Test
          (WordSplitSVTest_three_words_Test<wchar_t> *this)

{
  WordSplitSVTest_three_words_Test<wchar_t> *this_local;
  
  WordSplitSVTest<wchar_t>::WordSplitSVTest(&this->super_WordSplitSVTest<wchar_t>);
  *(undefined ***)&this->super_WordSplitSVTest<wchar_t> =
       &PTR__WordSplitSVTest_three_words_Test_00824148;
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, three_words) {
	auto word = make_word<TypeParam>(3);
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(5);
	word += default_delim<TypeParam>;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(9);
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 3);
	EXPECT_EQ(split_result[0].size(), 3);
	EXPECT_EQ(split_result[1].size(), 5);
	EXPECT_EQ(split_result[2].size(), 9);
}